

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable-common.h
# Opt level: O3

bool google::sparsehash_internal::write_bigendian_number<StringIO,unsigned_long>
               (StringIO *fp,unsigned_long value,size_t length)

{
  undefined1 uVar1;
  undefined8 in_RAX;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  uchar byte;
  undefined8 uStack_38;
  
  if (length != 0) {
    lVar3 = length * 8;
    uVar2 = length - 1;
    uStack_38 = in_RAX;
    do {
      lVar3 = lVar3 + -8;
      uVar1 = (undefined1)(value >> ((byte)lVar3 & 0x3f));
      if (7 < uVar2) {
        uVar1 = 0;
      }
      uStack_38 = CONCAT17(uVar1,(undefined7)uStack_38);
      std::__cxx11::string::append((char *)fp->s_,(long)&uStack_38 + 7);
      bVar4 = uVar2 != 0;
      uVar2 = uVar2 - 1;
    } while (bVar4);
  }
  return true;
}

Assistant:

bool write_bigendian_number(OUTPUT* fp, IntType value, size_t length) {
  unsigned char byte;
  // We require IntType to be unsigned or else the shifting gets all screwy.
  static_assert(static_cast<IntType>(-1) > static_cast<IntType>(0),
                "serializing int requires an unsigned type");
  for (size_t i = 0; i < length; ++i) {
    byte = (sizeof(value) <= length - 1 - i)
               ? 0
               : static_cast<unsigned char>((value >> ((length - 1 - i) * 8)) &
                                            255);
    if (!write_data(fp, &byte, sizeof(byte))) return false;
  }
  return true;
}